

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O0

void __thiscall
ByteData256_HexConstructorException_Test::~ByteData256_HexConstructorException_Test
          (ByteData256_HexConstructorException_Test *this)

{
  ByteData256_HexConstructorException_Test *this_local;
  
  ~ByteData256_HexConstructorException_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData256, HexConstructorException) {
  try {
    ByteData256 byte_data = ByteData256(
        "123456789012345678901234567890123456789000");
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "ByteData256 size unmatch.");
    return;
  }
  ASSERT_TRUE(false);
}